

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

void kill_eggs(obj *obj_list)

{
  boolean bVar1;
  obj *otmp;
  
  if (obj_list != (obj *)0x0) {
    do {
      if (obj_list->otyp == 0x10f) {
        bVar1 = dead_species(obj_list->corpsenm,'\x01');
        if (bVar1 != '\0') {
          kill_egg(obj_list);
        }
      }
      else if (obj_list->cobj != (obj *)0x0) {
        kill_eggs(obj_list->cobj);
      }
      obj_list = obj_list->nobj;
    } while (obj_list != (obj *)0x0);
  }
  return;
}

Assistant:

static void kill_eggs(struct obj *obj_list)
{
	struct obj *otmp;

	for (otmp = obj_list; otmp; otmp = otmp->nobj)
	    if (otmp->otyp == EGG) {
		if (dead_species(otmp->corpsenm, TRUE)) {
		    /*
		     * It seems we could also just catch this when
		     * it attempted to hatch, so we wouldn't have to
		     * search all of the objlists.. or stop all
		     * hatch timers based on a corpsenm.
		     */
		    kill_egg(otmp);
		}
	    } else if (Has_contents(otmp)) {
		kill_eggs(otmp->cobj);
	    }
}